

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

LogicalType *
duckdb::LogicalType::USER
          (LogicalType *__return_storage_ptr__,string *user_type_name,
          vector<duckdb::Value,_true> *user_type_mods)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_39;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_38;
  UserTypeInfo *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (UserTypeInfo *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::UserTypeInfo,std::allocator<duckdb::UserTypeInfo>,std::__cxx11::string_const&,duckdb::vector<duckdb::Value,true>const&>
            (&local_20,&local_28,(allocator<duckdb::UserTypeInfo> *)&local_39,user_type_name,
             user_type_mods);
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28->super_ExtraTypeInfo;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  LogicalType(__return_storage_ptr__,USER,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::USER(const string &user_type_name, const vector<Value> &user_type_mods) {
	auto info = make_shared_ptr<UserTypeInfo>(user_type_name, user_type_mods);
	return LogicalType(LogicalTypeId::USER, std::move(info));
}